

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error FT_Raccess_Get_DataOffsets
                   (FT_Library library,FT_Stream stream,FT_Long map_offset,FT_Long rdata_pos,
                   FT_Long tag,FT_Bool sort_by_res_id,FT_Long **offsets,FT_Long *count)

{
  FT_Memory pFVar1;
  FT_Stream stream_00;
  FT_UInt16 FVar2;
  FT_UInt16 FVar3;
  int iVar4;
  FT_UInt32 FVar5;
  FT_Long *pFVar6;
  size_t __nmemb;
  long *plVar7;
  ulong *puVar8;
  undefined7 in_register_00000089;
  long lVar9;
  int local_64;
  void *local_60;
  FT_Memory local_58;
  undefined4 local_4c;
  FT_Stream local_48;
  FT_Long local_40;
  FT_Long local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000089,sort_by_res_id);
  pFVar1 = library->memory;
  iVar4 = FT_Stream_Seek(stream,map_offset);
  if (((iVar4 == 0) &&
      (local_64 = iVar4, local_60 = (void *)tag, local_58 = pFVar1, local_40 = rdata_pos,
      local_38 = map_offset, FVar2 = FT_Stream_ReadUShort(stream,&local_64), iVar4 = local_64,
      local_64 == 0)) && (iVar4 = 8, (short)FVar2 < 0xfef)) {
    FVar3 = 0xffff;
    if (-1 < (short)FVar2) {
      FVar3 = FVar2;
    }
    iVar4 = (short)FVar3 + 2;
    local_48 = stream;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        return 1;
      }
      FVar5 = FT_Stream_ReadULong(stream,&local_64);
      if (local_64 != 0) {
        return local_64;
      }
      FVar2 = FT_Stream_ReadUShort(stream,&local_64);
      if (local_64 != 0) {
        return local_64;
      }
      FVar3 = FT_Stream_ReadUShort(stream,&local_64);
      stream_00 = local_48;
      if (local_64 != 0) {
        return local_64;
      }
    } while ((void *)(long)(int)FVar5 != local_60);
    *count = (long)(short)FVar2 + 1;
    iVar4 = 8;
    if (((FVar2 < 0xaa7) && (iVar4 = FT_Stream_Seek(local_48,(short)FVar3 + local_38), iVar4 == 0))
       && (local_64 = iVar4,
          local_60 = ft_mem_qrealloc(local_58,0x10,0,*count,(void *)0x0,&local_64), iVar4 = local_64
          , local_64 == 0)) {
      puVar8 = (ulong *)((long)local_60 + 8);
      for (lVar9 = 0; __nmemb = *count, lVar9 < (long)__nmemb; lVar9 = lVar9 + 1) {
        FVar2 = FT_Stream_ReadUShort(stream_00,&local_64);
        *(FT_UInt16 *)(puVar8 + -1) = FVar2;
        iVar4 = local_64;
        if (((local_64 != 0) ||
            (local_64 = FT_Stream_Skip(stream_00,2), iVar4 = local_64, local_64 != 0)) ||
           ((FVar5 = FT_Stream_ReadULong(stream_00,&local_64), iVar4 = local_64, local_64 != 0 ||
            (local_64 = FT_Stream_Skip(stream_00,4), iVar4 = local_64, local_64 != 0))))
        goto LAB_001de0e2;
        if ((int)FVar5 < 0) {
          iVar4 = 8;
          goto LAB_001de0e2;
        }
        *puVar8 = (ulong)(FVar5 & 0xffffff);
        puVar8 = puVar8 + 2;
      }
      if ((char)local_4c != '\0') {
        qsort(local_60,__nmemb,0x10,ft_raccess_sort_ref_by_id);
        __nmemb = *count;
      }
      pFVar6 = (FT_Long *)ft_mem_qrealloc(local_58,8,0,__nmemb,(void *)0x0,&local_64);
      iVar4 = local_64;
      if (local_64 == 0) {
        plVar7 = (long *)((long)local_60 + 8);
        for (lVar9 = 0; lVar9 < *count; lVar9 = lVar9 + 1) {
          pFVar6[lVar9] = *plVar7 + local_40;
          plVar7 = plVar7 + 2;
        }
        *offsets = pFVar6;
        iVar4 = 0;
      }
      if (local_60 != (void *)0x0) {
LAB_001de0e2:
        (*local_58->free)(local_58,local_60);
      }
    }
  }
  return iVar4;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Raccess_Get_DataOffsets( FT_Library  library,
                              FT_Stream   stream,
                              FT_Long     map_offset,
                              FT_Long     rdata_pos,
                              FT_Long     tag,
                              FT_Bool     sort_by_res_id,
                              FT_Long   **offsets,
                              FT_Long    *count )
  {
    FT_Error      error;
    int           i, j, cnt, subcnt;
    FT_Long       tag_internal, rpos;
    FT_Memory     memory = library->memory;
    FT_Long       temp;
    FT_Long       *offsets_internal = NULL;
    FT_RFork_Ref  *ref = NULL;


    FT_TRACE3(( "\n" ));
    error = FT_Stream_Seek( stream, (FT_ULong)map_offset );
    if ( error )
      return error;

    if ( FT_READ_SHORT( cnt ) )
      return error;
    cnt++;

    /* `rpos' is a signed 16bit integer offset to resource records; the    */
    /* size of a resource record is 12 bytes.  The map header is 28 bytes, */
    /* and a type list needs 10 bytes or more.  If we assume that the name */
    /* list is empty and we have only a single entry in the type list,     */
    /* there can be at most                                                */
    /*                                                                     */
    /*   (32768 - 28 - 10) / 12 = 2727                                     */
    /*                                                                     */
    /* resources.                                                          */
    /*                                                                     */
    /* A type list starts with a two-byte counter, followed by 10-byte     */
    /* type records.  Assuming that there are no resources, the number of  */
    /* type records can be at most                                         */
    /*                                                                     */
    /*   (32768 - 28 - 2) / 8 = 4079                                       */
    /*                                                                     */
    if ( cnt > 4079 )
      return FT_THROW( Invalid_Table );

    for ( i = 0; i < cnt; i++ )
    {
      if ( FT_READ_LONG( tag_internal ) ||
           FT_READ_SHORT( subcnt )      ||
           FT_READ_SHORT( rpos )        )
        return error;

      FT_TRACE2(( "Resource tags: %c%c%c%c\n",
                  (char)( 0xFF & ( tag_internal >> 24 ) ),
                  (char)( 0xFF & ( tag_internal >> 16 ) ),
                  (char)( 0xFF & ( tag_internal >>  8 ) ),
                  (char)( 0xFF & ( tag_internal >>  0 ) ) ));
      FT_TRACE3(( "             : subcount=%d, suboffset=0x%04lx\n",
                  subcnt, rpos ));

      if ( tag_internal == tag )
      {
        *count = subcnt + 1;
        rpos  += map_offset;

        /* a zero count might be valid in the resource specification, */
        /* however, it is completely useless to us                    */
        if ( *count < 1 || *count > 2727 )
          return FT_THROW( Invalid_Table );

        error = FT_Stream_Seek( stream, (FT_ULong)rpos );
        if ( error )
          return error;

        if ( FT_QNEW_ARRAY( ref, *count ) )
          return error;

        for ( j = 0; j < *count; j++ )
        {
          if ( FT_READ_SHORT( ref[j].res_id ) )
            goto Exit;
          if ( FT_STREAM_SKIP( 2 ) )  /* resource name offset */
            goto Exit;
          if ( FT_READ_LONG( temp ) ) /* attributes (8bit), offset (24bit) */
            goto Exit;
          if ( FT_STREAM_SKIP( 4 ) )  /* mbz */
            goto Exit;

          /*
           * According to Inside Macintosh: More Macintosh Toolbox,
           * "Resource IDs" (1-46), there are some reserved IDs.
           * However, FreeType2 is not a font synthesizer, no need
           * to check the acceptable resource ID.
           */
          if ( temp < 0 )
          {
            error = FT_THROW( Invalid_Table );
            goto Exit;
          }

          ref[j].offset = temp & 0xFFFFFFL;

          FT_TRACE3(( "             [%d]:"
                      " resource_id=0x%04x, offset=0x%08lx\n",
                      j, (FT_UShort)ref[j].res_id, ref[j].offset ));
        }

        if ( sort_by_res_id )
        {
          ft_qsort( ref,
                    (size_t)*count,
                    sizeof ( FT_RFork_Ref ),
                    ft_raccess_sort_ref_by_id );

          FT_TRACE3(( "             -- sort resources by their ids --\n" ));

          for ( j = 0; j < *count; j++ )
            FT_TRACE3(( "             [%d]:"
                        " resource_id=0x%04x, offset=0x%08lx\n",
                        j, ref[j].res_id, ref[j].offset ));
        }

        if ( FT_QNEW_ARRAY( offsets_internal, *count ) )
          goto Exit;

        /* XXX: duplicated reference ID,
         *      gap between reference IDs are acceptable?
         *      further investigation on Apple implementation is needed.
         */
        for ( j = 0; j < *count; j++ )
          offsets_internal[j] = rdata_pos + ref[j].offset;

        *offsets = offsets_internal;
        error    = FT_Err_Ok;

      Exit:
        FT_FREE( ref );
        return error;
      }
    }

    return FT_THROW( Cannot_Open_Resource );
  }